

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

NodePtr __thiscall avro::NodeSymbolic::getNode(NodeSymbolic *this)

{
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  shared_count extraout_RDX;
  long *in_RSI;
  NodePtr NVar1;
  put_holder<char,_std::char_traits<char>_> local_118;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>((shared_ptr<avro::Node> *)this,in_RSI + 0xb)
  ;
  if ((this->super_NodeImplSymbolic).super_Node._vptr_Node != (_func_int **)0x0) {
    NVar1.pn.pi_ = extraout_RDX.pi_;
    NVar1.px = (element_type *)this;
    return NVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,"Could not follow symbol %1%");
  local_118.arg = (void *)(**(code **)(*in_RSI + 0x18))();
  local_118.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,avro::Name_const>;
  local_118.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,avro::Name_const>;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_100,&local_118);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodePtr getNode() const {
        NodePtr node = actualNode_.lock();
        if(!node) {
            throw Exception(boost::format("Could not follow symbol %1%") % name());
        }
        return node;
    }